

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O2

void __thiscall duckdb::FixedDecimalStatistics::Update(FixedDecimalStatistics *this,hugeint_t *val)

{
  int64_t iVar1;
  bool bVar2;
  
  bVar2 = GreaterThan::Operation<duckdb::hugeint_t>(&this->min,val);
  if (bVar2) {
    iVar1 = val->upper;
    (this->min).lower = val->lower;
    (this->min).upper = iVar1;
  }
  bVar2 = GreaterThan::Operation<duckdb::hugeint_t>(val,&this->max);
  if (bVar2) {
    iVar1 = val->upper;
    (this->max).lower = val->lower;
    (this->max).upper = iVar1;
  }
  return;
}

Assistant:

void Update(hugeint_t &val) {
		if (LessThan::Operation(val, min)) {
			min = val;
		}
		if (GreaterThan::Operation(val, max)) {
			max = val;
		}
	}